

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

void __thiscall
Time::Time::Time(Time *this,int year,int month,int dayOfMonth,int hour,int min,int sec)

{
  time_t tVar1;
  tm local_48;
  
  this->_vptr_Time = (_func_int **)&PTR_getAsDate_00128d10;
  local_48.tm_wday = 0;
  local_48.tm_yday = 0;
  local_48.tm_zone = (char *)0x0;
  local_48.tm_isdst = 0;
  local_48._36_4_ = 0;
  local_48.tm_gmtoff = 0;
  local_48.tm_year = year;
  local_48.tm_mon = month;
  local_48.tm_mday = dayOfMonth;
  local_48.tm_hour = hour;
  local_48.tm_min = min;
  local_48.tm_sec = sec;
  tVar1 = timeGM(&local_48);
  (this->timeSinceEpoch).tv_sec = tVar1;
  (this->timeSinceEpoch).tv_usec = 0;
  return;
}

Assistant:

Time::Time(const int year, const int month, const int dayOfMonth, const int hour, const int min, const int sec)
    {
#if defined(_WIN32) || defined(_POSIX)
        struct tm ekT = {0};
        ekT.tm_year = year;
        ekT.tm_mon = month;
        ekT.tm_mday = dayOfMonth;
        ekT.tm_hour = hour;
        ekT.tm_min = min;
        ekT.tm_sec = sec;
        timeSinceEpoch.tv_sec = timeGM(&ekT);
        timeSinceEpoch.tv_usec = 0;
#else
        timeSinceEpoch.tv_sec = 0;
        timeSinceEpoch.tv_usec = 0;
#endif
    }